

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O3

value * __thiscall
mjs::value_representation::get_value
          (value *__return_storage_ptr__,value_representation *this,gc_heap *heap)

{
  ulong uVar1;
  wostream *pwVar2;
  char *pcVar3;
  uint uVar4;
  undefined1 *rhs;
  gc_heap *this_00;
  value_type t;
  wostringstream woss;
  undefined1 local_1c0 [40];
  gc_heap *local_198;
  gc_heap local_190 [3];
  
  uVar1 = this->repr_;
  if ((~uVar1 & 0x7ff0000000000000) != 0 || (uVar1 & 0xf000000000000) == 0) {
    __return_storage_ptr__->type_ = number;
    *(ulong *)&__return_storage_ptr__->field_1 = uVar1;
    return __return_storage_ptr__;
  }
  t = ((ushort)(uVar1 >> 0x30) & 0xf) - null;
  uVar4 = (uint)uVar1;
  switch(t) {
  case undefined:
    if (uVar4 != 0) {
      __assert_fail("!payload",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                    ,0x45,"value mjs::value_representation::get_value(gc_heap &) const");
    }
    rhs = (undefined1 *)&value::undefined;
    break;
  case null:
    if (uVar4 != 0) {
      __assert_fail("!payload",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                    ,0x46,"value mjs::value_representation::get_value(gc_heap &) const");
    }
    rhs = value::null;
    break;
  case boolean:
    if (uVar4 < 2) {
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = SUB81(uVar1,0);
      return __return_storage_ptr__;
    }
    __assert_fail("payload == 0 || payload == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                  ,0x47,"value mjs::value_representation::get_value(gc_heap &) const");
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
    pwVar2 = std::operator<<((wostream *)local_190,"Not handled: ");
    pcVar3 = string_value(t);
    pwVar2 = std::operator<<(pwVar2,pcVar3);
    pwVar2 = std::operator<<(pwVar2," ");
    std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    std::__cxx11::wstringbuf::str();
    local_198 = (gc_heap *)local_1c0._0_8_;
    throw_runtime_error((wstring_view *)(local_1c0 + 0x20),
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x4f);
  case string:
    gc_heap::unsafe_create_from_position<mjs::gc_string>((gc_heap *)local_1c0,(uint32_t)heap);
    local_190[0].pointers_.set_ = (gc_heap_ptr_untyped **)local_1c0._0_8_;
    local_190[0].pointers_.capacity_ = local_1c0._8_4_;
    if ((gc_heap *)local_1c0._0_8_ == (gc_heap *)0x0) {
      __return_storage_ptr__->type_ = string;
      (__return_storage_ptr__->field_1).n_ = 0.0;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1c0._8_4_;
    }
    else {
      gc_heap::attach((gc_heap *)local_1c0._0_8_,(gc_heap_ptr_untyped *)local_190);
      __return_storage_ptr__->type_ = string;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_190[0].pointers_.set_;
      *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_190[0].pointers_.capacity_;
      if ((gc_heap *)local_190[0].pointers_.set_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_190[0].pointers_.set_,
                        (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_190);
    this_00 = (gc_heap *)local_1c0;
    goto LAB_0015f6e8;
  case object:
    gc_heap::unsafe_create_from_position<mjs::object>(local_190,(uint32_t)heap);
    __return_storage_ptr__->type_ = object;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = (gc_heap *)local_190[0].pointers_.set_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_190[0].pointers_.capacity_;
    if ((gc_heap *)local_190[0].pointers_.set_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_190[0].pointers_.set_,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    this_00 = local_190;
LAB_0015f6e8:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_00);
    return __return_storage_ptr__;
  }
  value::value(__return_storage_ptr__,(value *)rhs);
  return __return_storage_ptr__;
}

Assistant:

value value_representation::get_value(gc_heap& heap) const {
    if (!is_special(repr_)) {
        double d;
        static_assert(sizeof(d) == sizeof(repr_));
        std::memcpy(&d, &repr_, sizeof(d));
        return value{d};
    }
    const auto type    = type_from_repr(repr_);
    const auto payload = static_cast<uint32_t>(repr_);
    switch (type) {
    case value_type::undefined: assert(!payload); return value::undefined;
    case value_type::null:      assert(!payload); return value::null;
    case value_type::boolean:   assert(payload == 0 || payload == 1); return value{!!payload};
    case value_type::number:    /*should be handled above*/ break;
    case value_type::string:    return value{string{heap.unsafe_create_from_position<gc_string>(payload)}};
    case value_type::object:    return value{heap.unsafe_create_from_position<object>(payload)};
    default:                    break;
    }
    std::wostringstream woss;
    woss << "Not handled: " << type << " " << repr_;
    THROW_RUNTIME_ERROR(woss.str());
}